

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemTable.cpp
# Opt level: O2

void __thiscall ItemTable::WhiteRoomOne(ItemTable *this)

{
  ItemWrapper *this_00;
  ItemWrapper *this_01;
  ItemWrapper *this_02;
  ItemWrapper *pIVar1;
  mapped_type *ppIVar2;
  key_type local_1a4;
  ItemWrapper *local_1a0;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  Item local_f8;
  Item local_d0;
  Item local_a8;
  Item local_80;
  Item local_58;
  
  this_00 = (ItemWrapper *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_118,"Disc",(allocator *)&local_1a4);
  Item::Item(&local_58,&local_118,DISCUS);
  ItemWrapper::ItemWrapper(this_00,&local_58,W_ROOM1);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_118);
  this_01 = (ItemWrapper *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_138,"PowerCrystal",(allocator *)&local_1a4);
  Item::Item(&local_80,&local_138,POWER_CRYSTAL);
  ItemWrapper::ItemWrapper(this_01,&local_80,W_ROOM1);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_138);
  this_02 = (ItemWrapper *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_158,"Torch",(allocator *)&local_1a4);
  Item::Item(&local_a8,&local_158,TORCH);
  ItemWrapper::ItemWrapper(this_02,&local_a8,W_ROOM1);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_158);
  pIVar1 = (ItemWrapper *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_178,"Light Pillar",(allocator *)&local_1a4);
  local_1a0 = pIVar1;
  Item::Item(&local_d0,&local_178,LIGHT_PILLAR);
  ItemWrapper::ItemWrapper(pIVar1,&local_d0,W_ROOM1);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_178);
  pIVar1 = (ItemWrapper *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_198,"Ladder",(allocator *)&local_1a4);
  Item::Item(&local_f8,&local_198,LADDER);
  ItemWrapper::ItemWrapper(pIVar1,&local_f8,HIDDEN);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_198);
  local_1a4 = DISCUS;
  ppIVar2 = std::
            map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
            ::operator[](&this->items,&local_1a4);
  *ppIVar2 = this_00;
  local_1a4 = POWER_CRYSTAL;
  ppIVar2 = std::
            map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
            ::operator[](&this->items,&local_1a4);
  *ppIVar2 = this_01;
  local_1a4 = TORCH;
  ppIVar2 = std::
            map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
            ::operator[](&this->items,&local_1a4);
  *ppIVar2 = this_02;
  local_1a4 = LIGHT_PILLAR;
  ppIVar2 = std::
            map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
            ::operator[](&this->items,&local_1a4);
  *ppIVar2 = local_1a0;
  local_1a4 = LADDER;
  ppIVar2 = std::
            map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
            ::operator[](&this->items,&local_1a4);
  *ppIVar2 = pIVar1;
  return;
}

Assistant:

void ItemTable::WhiteRoomOne() {
    //    DISCUS, POWER_CRYSTAL, TORCH, LIGHT_PILLAR,

    ItemWrapper * Discus         = new ItemWrapper(Item("Disc", DISCUS), W_ROOM1);
    ItemWrapper * PowerCrystal   = new ItemWrapper(Item("PowerCrystal", POWER_CRYSTAL), W_ROOM1);
    ItemWrapper * Torch          = new ItemWrapper(Item("Torch", TORCH), W_ROOM1);
    ItemWrapper * LPiller        = new ItemWrapper(Item("Light Pillar", LIGHT_PILLAR), W_ROOM1);
    ItemWrapper * Ladder         = new ItemWrapper(Item("Ladder", LADDER), HIDDEN);

    items[DISCUS] = Discus;
    items[POWER_CRYSTAL] = PowerCrystal;
    items[TORCH] = Torch;
    items[LIGHT_PILLAR] = LPiller;
    items[LADDER] = Ladder;
}